

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogt_vox.h
# Opt level: O0

ogt_vox_scene *
ogt_vox_merge_scenes
          (ogt_vox_scene **scenes,uint32_t scene_count,ogt_vox_rgba *required_colors,
          uint32_t required_color_count)

{
  ogt_vox_rgba *poVar1;
  undefined8 uVar2;
  uint32_t uVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  void *__src;
  ogt_vox_model **__dest;
  ogt_vox_scene *__s;
  ogt_vox_scene *poVar7;
  size_t sVar8;
  uint *puVar9;
  int local_4ae8;
  float local_4ae0;
  uint local_4ac4;
  uint local_4ac0;
  uint32_t color_index_2;
  uint32_t color_index_1;
  uint32_t keyframe_size_2;
  size_t string_len_1;
  uint32_t group_index_1;
  uint32_t keyframe_size_1;
  uint32_t j;
  int32_t scene_index_2;
  uint32_t keyframe_size;
  ogt_vox_keyframe_model *model_keyframes;
  size_t string_len;
  ogt_vox_scene *poStack_4a80;
  uint32_t instance_index_1;
  char *scene_misc_data;
  ogt_vox_scene *merged_scene;
  size_t scene_size;
  uint32_t color_index;
  ogt_vox_rgba k_invalid_color;
  ogt_vox_instance *dst_instance;
  ogt_vox_instance *src_instance;
  char *pcStack_4a48;
  uint32_t instance_index;
  ogt_vox_group dst_group;
  ogt_vox_group *src_group;
  uint32_t group_index;
  float scene_offset_x;
  int32_t scene_max_x;
  int32_t scene_min_x;
  uint32_t new_color_index;
  uint8_t old_color_index;
  uint8_t *puStack_49b8;
  uint32_t voxel_index;
  uint8_t *override_voxel_data;
  ogt_vox_model *override_model;
  int *piStack_49a0;
  uint32_t voxel_count;
  ogt_vox_model *model;
  uint local_4990;
  uint32_t model_index;
  uint32_t base_group_index;
  uint32_t base_model_index;
  uint32_t scene_color_index_to_master_map [256];
  ogt_vox_scene *scene;
  uint32_t scene_index_1;
  int32_t offset_x;
  size_t misc_data_size;
  undefined1 local_4560 [8];
  _vox_array<unsigned_int> per_scene_base_instance_index;
  _vox_array<unsigned_int> per_scene_base_model_index;
  char *pcStack_4528;
  uint32_t num_groups;
  ogt_vox_transform oStack_4520;
  ogt_vox_group root_group;
  uint32_t global_root_group_index;
  uint32_t local_4470;
  uint32_t num_layers;
  uint32_t num_models;
  uint32_t num_instances;
  ogt_vox_group *groups;
  ogt_vox_layer *layers;
  ogt_vox_model **models;
  ogt_vox_instance *instances;
  uint local_4440;
  uint32_t scene_index;
  uint32_t max_groups;
  uint32_t max_instances;
  uint32_t max_models;
  uint32_t max_layers;
  uint32_t required_index;
  uint32_t master_palette_count;
  ogt_vox_matl materials [256];
  ogt_vox_rgba master_palette [256];
  uint32_t required_color_count_local;
  ogt_vox_rgba *required_colors_local;
  uint32_t scene_count_local;
  ogt_vox_scene **scenes_local;
  
  if (0xff < required_color_count) {
    __assert_fail("(required_color_count <= 255) && (\"too many colors specified\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                  ,0xb6c,
                  "ogt_vox_scene *ogt_vox_merge_scenes(const ogt_vox_scene **, uint32_t, const ogt_vox_rgba *, const uint32_t)"
                 );
  }
  max_layers = 1;
  memset(&materials[0xff].g,0,0x400);
  memset(&required_index,0,0x4000);
  for (max_models = 0; max_models < required_color_count; max_models = max_models + 1) {
    master_palette[(ulong)max_layers - 2] = required_colors[max_models];
    max_layers = max_layers + 1;
  }
  max_instances = 1;
  max_groups = 0;
  scene_index = 0;
  local_4440 = 1;
  for (instances._4_4_ = 0; instances._4_4_ < scene_count; instances._4_4_ = instances._4_4_ + 1) {
    if (scenes[instances._4_4_] != (ogt_vox_scene *)0x0) {
      scene_index = scenes[instances._4_4_]->num_instances + scene_index;
      max_groups = scenes[instances._4_4_]->num_models + max_groups;
      local_4440 = scenes[instances._4_4_]->num_groups + local_4440;
    }
  }
  models = (ogt_vox_model **)_vox_malloc((ulong)scene_index * 0x78);
  layers = (ogt_vox_layer *)_vox_malloc((ulong)max_groups << 3);
  groups = (ogt_vox_group *)_vox_malloc((ulong)max_instances << 4);
  _num_models = (ogt_vox_group *)_vox_malloc((ulong)local_4440 * 0x68);
  num_layers = 0;
  local_4470 = 0;
  *(undefined1 *)&(groups->transform).m01 = 0;
  (groups->transform).m00 = -NAN;
  groups->name = "merged";
  root_group.transform_anim.loop = false;
  root_group.transform_anim._13_3_ = 0;
  root_group.parent_group_index._0_1_ = 0;
  root_group.transform.m33 = 0.0;
  root_group.transform.m32 = -NAN;
  ogt_vox_transform_get_identity();
  root_group.transform._40_8_ = oStack_4520._40_8_;
  root_group.transform._48_8_ = oStack_4520._48_8_;
  root_group.transform._24_8_ = oStack_4520._24_8_;
  root_group.transform._32_8_ = oStack_4520._32_8_;
  root_group.transform._8_8_ = oStack_4520._8_8_;
  root_group.transform._16_8_ = oStack_4520._16_8_;
  root_group.name = pcStack_4528;
  root_group.transform._0_8_ = oStack_4520._0_8_;
  clear_anim_transform((ogt_vox_anim_transform *)&root_group.hidden);
  *(ogt_vox_keyframe_transform **)&(_num_models->transform_anim).num_keyframes =
       root_group.transform_anim.keyframes;
  *(ulong *)&_num_models->hidden =
       CONCAT71(root_group._73_7_,(undefined1)root_group.parent_group_index);
  (_num_models->transform_anim).keyframes = (ogt_vox_keyframe_transform *)root_group._80_8_;
  (_num_models->transform).m32 = root_group.transform.m30;
  (_num_models->transform).m33 = root_group.transform.m31;
  _num_models->parent_group_index = (uint32_t)root_group.transform.m32;
  _num_models->layer_index = (uint32_t)root_group.transform.m33;
  (_num_models->transform).m22 = root_group.transform.m20;
  (_num_models->transform).m23 = root_group.transform.m21;
  (_num_models->transform).m30 = root_group.transform.m22;
  (_num_models->transform).m31 = root_group.transform.m23;
  (_num_models->transform).m12 = root_group.transform.m10;
  (_num_models->transform).m13 = root_group.transform.m11;
  (_num_models->transform).m20 = root_group.transform.m12;
  (_num_models->transform).m21 = root_group.transform.m13;
  (_num_models->transform).m02 = root_group.transform.m00;
  (_num_models->transform).m03 = root_group.transform.m01;
  (_num_models->transform).m10 = root_group.transform.m02;
  (_num_models->transform).m11 = root_group.transform.m03;
  _num_models->name = (char *)0x0;
  *(char **)&_num_models->transform = root_group.name;
  per_scene_base_model_index.count._4_4_ = 1;
  _vox_array<unsigned_int>::_vox_array
            ((_vox_array<unsigned_int> *)&per_scene_base_instance_index.count);
  _vox_array<unsigned_int>::_vox_array((_vox_array<unsigned_int> *)local_4560);
  _scene_index_1 = 0;
  scene._4_4_ = 0;
  for (scene._0_4_ = 0; (uint)scene < scene_count; scene._0_4_ = (uint)scene + 1) {
    scene_color_index_to_master_map._1016_8_ = scenes[(uint)scene];
    if ((ogt_vox_scene *)scene_color_index_to_master_map._1016_8_ != (ogt_vox_scene *)0x0) {
      update_master_palette_and_materials_from_scene
                ((ogt_vox_rgba *)&materials[0xff].g,&max_layers,
                 (ogt_vox_scene *)scene_color_index_to_master_map._1016_8_,&base_group_index,
                 (ogt_vox_matl *)&required_index);
      model_index = local_4470;
      local_4990 = per_scene_base_model_index.count._4_4_;
      _vox_array<unsigned_int>::push_back
                ((_vox_array<unsigned_int> *)&per_scene_base_instance_index.count,&model_index);
      _vox_array<unsigned_int>::push_back((_vox_array<unsigned_int> *)local_4560,&num_layers);
      for (model._4_4_ = 0; model._4_4_ < *(uint *)scene_color_index_to_master_map._1016_8_;
          model._4_4_ = model._4_4_ + 1) {
        piStack_49a0 = *(int **)(*(long *)(scene_color_index_to_master_map._1016_8_ + 0x10) +
                                (ulong)model._4_4_ * 8);
        override_model._4_4_ = *piStack_49a0 * piStack_49a0[1] * piStack_49a0[2];
        override_voxel_data = (uint8_t *)_vox_malloc((ulong)override_model._4_4_ + 0x18);
        puStack_49b8 = override_voxel_data + 0x18;
        for (new_color_index = 0; new_color_index < override_model._4_4_;
            new_color_index = new_color_index + 1) {
          scene_min_x._3_1_ = *(byte *)(*(long *)(piStack_49a0 + 4) + (ulong)new_color_index);
          scene_max_x = (&base_group_index)[scene_min_x._3_1_];
          if (0xff < (uint)scene_max_x) {
            __assert_fail("(new_color_index < 256) && (\"color index out of bounds\")",
                          "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                          ,0xbc4,
                          "ogt_vox_scene *ogt_vox_merge_scenes(const ogt_vox_scene **, uint32_t, const ogt_vox_rgba *, const uint32_t)"
                         );
          }
          puStack_49b8[new_color_index] = (uint8_t)scene_max_x;
        }
        *(undefined8 *)(override_voxel_data + 0x10) = *(undefined8 *)(piStack_49a0 + 4);
        uVar2 = *(undefined8 *)(piStack_49a0 + 2);
        *(undefined8 *)override_voxel_data = *(undefined8 *)piStack_49a0;
        *(undefined8 *)(override_voxel_data + 8) = uVar2;
        *(uint8_t **)(override_voxel_data + 0x10) = puStack_49b8;
        uVar3 = _vox_hash(puStack_49b8,override_model._4_4_);
        *(uint32_t *)(override_voxel_data + 0xc) = uVar3;
        (&layers->name)[local_4470] = (char *)override_voxel_data;
        local_4470 = local_4470 + 1;
      }
      compute_scene_bounding_box_x
                ((ogt_vox_scene *)scene_color_index_to_master_map._1016_8_,
                 (int32_t *)&scene_offset_x,(int32_t *)&group_index);
      iVar4 = scene._4_4_ - (int)scene_offset_x;
      if (*(int *)(*(long *)(scene_color_index_to_master_map._1016_8_ + 0x28) + 0x48) != -1) {
        __assert_fail("(scene->groups[0].parent_group_index == k_invalid_group_index) && (\"first group of scene must not be parented to any other group\")"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                      ,0xbd7,
                      "ogt_vox_scene *ogt_vox_merge_scenes(const ogt_vox_scene **, uint32_t, const ogt_vox_rgba *, const uint32_t)"
                     );
      }
      for (src_group._4_4_ = 1;
          src_group._4_4_ < *(uint *)(scene_color_index_to_master_map._1016_8_ + 0xc);
          src_group._4_4_ = src_group._4_4_ + 1) {
        dst_group.transform_anim._8_8_ =
             *(long *)(scene_color_index_to_master_map._1016_8_ + 0x28) +
             (ulong)src_group._4_4_ * 0x68;
        if (*(int *)(dst_group.transform_anim._8_8_ + 0x48) == -1) {
          __assert_fail("(src_group->parent_group_index != k_invalid_group_index) && (\"all groups after the first in the scene must be parented to a valid group\")"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                        ,0xbdb,
                        "ogt_vox_scene *ogt_vox_merge_scenes(const ogt_vox_scene **, uint32_t, const ogt_vox_rgba *, const uint32_t)"
                       );
        }
        memcpy(&stack0xffffffffffffb5b8,(void *)dst_group.transform_anim._8_8_,0x68);
        if ((uint)*(float *)(scene_color_index_to_master_map._1016_8_ + 0xc) <=
            (uint)dst_group.transform.m32) {
          __assert_fail("(dst_group.parent_group_index < scene->num_groups) && (\"group index is out of bounds\")"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                        ,0xbdd,
                        "ogt_vox_scene *ogt_vox_merge_scenes(const ogt_vox_scene **, uint32_t, const ogt_vox_rgba *, const uint32_t)"
                       );
        }
        dst_group.transform.m33 = 0.0;
        if (dst_group.transform.m32 == 0.0) {
          local_4ae0 = (float)root_group.transform_anim._12_4_;
        }
        else {
          local_4ae0 = (float)(local_4990 + (int)dst_group.transform.m32 + -1);
        }
        dst_group.transform.m32 = local_4ae0;
        if (pcStack_4a48 != (char *)0x0) {
          sVar6 = strlen(pcStack_4a48);
          _scene_index_1 = sVar6 + 1 + _scene_index_1;
        }
        if ((uint)dst_group.transform_anim.keyframes != 0) {
          _scene_index_1 = (ulong)(uint)dst_group.transform_anim.keyframes * 0x44 + _scene_index_1;
        }
        if (dst_group.transform.m32 == (float)root_group.transform_anim._12_4_) {
          dst_group.transform.m22 = (float)iVar4 + dst_group.transform.m22;
        }
        memcpy(_num_models + per_scene_base_model_index.count._4_4_,&stack0xffffffffffffb5b8,0x68);
        per_scene_base_model_index.count._4_4_ = per_scene_base_model_index.count._4_4_ + 1;
      }
      for (src_instance._4_4_ = 0;
          src_instance._4_4_ < *(uint *)(scene_color_index_to_master_map._1016_8_ + 4);
          src_instance._4_4_ = src_instance._4_4_ + 1) {
        __src = (void *)(*(long *)(scene_color_index_to_master_map._1016_8_ + 0x18) +
                        (ulong)src_instance._4_4_ * 0x78);
        if (*(uint *)(scene_color_index_to_master_map._1016_8_ + 0xc) <=
            *(uint *)((long)__src + 0x50)) {
          __assert_fail("(src_instance->group_index < scene->num_groups) && (\"group index is out of bounds\")"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                        ,0xbed,
                        "ogt_vox_scene *ogt_vox_merge_scenes(const ogt_vox_scene **, uint32_t, const ogt_vox_rgba *, const uint32_t)"
                       );
        }
        __dest = models + (ulong)num_layers * 0xf;
        num_layers = num_layers + 1;
        memcpy(__dest,__src,0x78);
        *(undefined4 *)((long)__dest + 0x4c) = 0;
        if (*(int *)(__dest + 10) == 0) {
          local_4ae8 = root_group.transform_anim._12_4_;
        }
        else {
          local_4ae8 = local_4990 + *(int *)(__dest + 10) + -1;
        }
        *(int *)(__dest + 10) = local_4ae8;
        *(uint32_t *)(__dest + 9) = model_index + *(int *)(__dest + 9);
        if (*__dest != (ogt_vox_model *)0x0) {
          sVar6 = strlen((char *)*__dest);
          _scene_index_1 = sVar6 + 1 + _scene_index_1;
        }
        if (*(int *)(__dest + 0xc) != 0) {
          _scene_index_1 = (ulong)*(uint *)(__dest + 0xc) * 0x44 + _scene_index_1;
        }
        if (*(int *)(__dest + 0xe) != 0) {
          _scene_index_1 = (ulong)*(uint *)(__dest + 0xe) * 8 + _scene_index_1;
        }
        if (*(int *)(__dest + 10) == root_group.transform_anim._12_4_) {
          *(float *)(__dest + 7) = (float)iVar4 + *(float *)(__dest + 7);
        }
      }
      scene._4_4_ = (group_index - (int)scene_offset_x) + scene._4_4_ + 4;
    }
  }
  for (scene_size._0_4_ = max_layers; (uint)scene_size < 0x100;
      scene_size._0_4_ = (uint)scene_size + 1) {
    poVar1 = master_palette + ((ulong)(uint)scene_size - 2);
    poVar1->r = 0xff;
    poVar1->g = '\0';
    poVar1->b = 0xff;
    poVar1->a = 0xff;
  }
  __s = (ogt_vox_scene *)_vox_calloc(_scene_index_1 + 0x4440);
  poStack_4a80 = __s + 1;
  string_len._4_4_ = 0;
  do {
    if (num_layers <= string_len._4_4_) {
      for (string_len_1._4_4_ = 0; string_len_1._4_4_ < per_scene_base_model_index.count._4_4_;
          string_len_1._4_4_ = string_len_1._4_4_ + 1) {
        if (_num_models[string_len_1._4_4_].name != (char *)0x0) {
          sVar6 = strlen(_num_models[string_len_1._4_4_].name);
          memcpy(poStack_4a80,_num_models[string_len_1._4_4_].name,sVar6 + 1);
          _num_models[string_len_1._4_4_].name = (char *)poStack_4a80;
          poStack_4a80 = (ogt_vox_scene *)((long)(poStack_4a80->palette).color + (sVar6 - 0x2f));
        }
        if (_num_models[string_len_1._4_4_].transform_anim.num_keyframes != 0) {
          uVar5 = _num_models[string_len_1._4_4_].transform_anim.num_keyframes * 0x44;
          memcpy(poStack_4a80,_num_models[string_len_1._4_4_].transform_anim.keyframes,(ulong)uVar5)
          ;
          _num_models[string_len_1._4_4_].transform_anim.keyframes =
               (ogt_vox_keyframe_transform *)poStack_4a80;
          poStack_4a80 = (ogt_vox_scene *)
                         ((long)((poStack_4a80->palette).color + -0xc) + (ulong)uVar5);
        }
      }
      if (poStack_4a80 <= (ogt_vox_scene *)((long)(__s[1].palette.color + -0xc) + _scene_index_1)) {
        if (per_scene_base_model_index.count._4_4_ <= local_4440) {
          memset(__s,0,0x4440);
          __s->instances = (ogt_vox_instance *)models;
          __s->num_instances = scene_index;
          __s->models = (ogt_vox_model **)layers;
          __s->num_models = max_groups;
          __s->layers = (ogt_vox_layer *)groups;
          __s->num_layers = max_instances;
          __s->groups = _num_models;
          __s->num_groups = per_scene_base_model_index.count._4_4_;
          for (local_4ac0 = 0; local_4ac0 < 0x100; local_4ac0 = local_4ac0 + 1) {
            (__s->palette).color[local_4ac0] = master_palette[(ulong)local_4ac0 - 2];
          }
          for (local_4ac4 = 0; local_4ac4 < 0x100; local_4ac4 = local_4ac4 + 1) {
            memcpy((__s->materials).matl + local_4ac4,&required_index + (ulong)local_4ac4 * 0x10,
                   0x40);
          }
          _vox_array<unsigned_int>::~_vox_array((_vox_array<unsigned_int> *)local_4560);
          _vox_array<unsigned_int>::~_vox_array
                    ((_vox_array<unsigned_int> *)&per_scene_base_instance_index.count);
          return __s;
        }
        __assert_fail("(num_groups <= max_groups) && (\"sanity check failed. we wrote more groups than we allocated\")"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                      ,0xc3f,
                      "ogt_vox_scene *ogt_vox_merge_scenes(const ogt_vox_scene **, uint32_t, const ogt_vox_rgba *, const uint32_t)"
                     );
      }
      __assert_fail("(scene_misc_data <= ((char*)&merged_scene[1] + misc_data_size)) && (\"misc_data allocation was overrun\")"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                    ,0xc3c,
                    "ogt_vox_scene *ogt_vox_merge_scenes(const ogt_vox_scene **, uint32_t, const ogt_vox_rgba *, const uint32_t)"
                   );
    }
    if (models[(ulong)string_len._4_4_ * 0xf] != (ogt_vox_model *)0x0) {
      sVar6 = strlen((char *)models[(ulong)string_len._4_4_ * 0xf]);
      memcpy(poStack_4a80,models[(ulong)string_len._4_4_ * 0xf],sVar6 + 1);
      models[(ulong)string_len._4_4_ * 0xf] = (ogt_vox_model *)poStack_4a80;
      poStack_4a80 = (ogt_vox_scene *)((long)(poStack_4a80->palette).color + (sVar6 - 0x2f));
    }
    poVar7 = poStack_4a80;
    if (*(int *)(models + (ulong)string_len._4_4_ * 0xf + 0xe) != 0) {
      iVar4 = *(int *)(models + (ulong)string_len._4_4_ * 0xf + 0xe);
      memcpy(poStack_4a80,models[(ulong)string_len._4_4_ * 0xf + 0xd],(ulong)(uint)(iVar4 << 3));
      models[(ulong)string_len._4_4_ * 0xf + 0xd] = (ogt_vox_model *)poStack_4a80;
      poVar7 = (ogt_vox_scene *)
               ((long)((poStack_4a80->palette).color + -0xc) + (ulong)(uint)(iVar4 << 3));
      sVar8 = _vox_array<unsigned_int>::size((_vox_array<unsigned_int> *)local_4560);
      keyframe_size_1 = (uint32_t)sVar8;
      do {
        keyframe_size_1 = keyframe_size_1 - 1;
        if ((int)keyframe_size_1 < 0) goto LAB_0010d3ff;
        puVar9 = _vox_array<unsigned_int>::operator[]
                           ((_vox_array<unsigned_int> *)local_4560,(long)(int)keyframe_size_1);
      } while (string_len._4_4_ < *puVar9);
      for (group_index_1 = 0;
          group_index_1 < *(uint *)(models + (ulong)string_len._4_4_ * 0xf + 0xe);
          group_index_1 = group_index_1 + 1) {
        puVar9 = _vox_array<unsigned_int>::operator[]
                           ((_vox_array<unsigned_int> *)&per_scene_base_instance_index.count,
                            (long)(int)keyframe_size_1);
        (poStack_4a80->palette).color[(ulong)group_index_1 * 2 + -0xb] =
             (ogt_vox_rgba)
             (*puVar9 + (int)(poStack_4a80->palette).color[(ulong)group_index_1 * 2 + -0xb]);
      }
    }
LAB_0010d3ff:
    poStack_4a80 = poVar7;
    if (*(int *)(models + (ulong)string_len._4_4_ * 0xf + 0xc) != 0) {
      iVar4 = *(int *)(models + (ulong)string_len._4_4_ * 0xf + 0xc);
      memcpy(poStack_4a80,models[(ulong)string_len._4_4_ * 0xf + 0xb],(ulong)(uint)(iVar4 * 0x44));
      models[(ulong)string_len._4_4_ * 0xf + 0xb] = (ogt_vox_model *)poStack_4a80;
      poStack_4a80 = (ogt_vox_scene *)
                     ((long)((poStack_4a80->palette).color + -0xc) + (ulong)(uint)(iVar4 * 0x44));
    }
    string_len._4_4_ = string_len._4_4_ + 1;
  } while( true );
}

Assistant:

ogt_vox_scene* ogt_vox_merge_scenes(const ogt_vox_scene** scenes, uint32_t scene_count, const ogt_vox_rgba* required_colors, const uint32_t required_color_count) {
        ogt_assert(required_color_count <= 255, "too many colors specified"); // can't exceed the maximum colors in the master palette plus the empty slot.

        // initialize the master palette. If required colors are specified, map them into the master palette now.
        ogt_vox_rgba  master_palette[256];
        ogt_vox_matl materials[256];
        uint32_t master_palette_count = 1;          // color_index 0 is reserved for empty color!
        memset(&master_palette, 0, sizeof(master_palette));
        memset(&materials, 0, sizeof(materials));
        for (uint32_t required_index = 0; required_index < required_color_count; required_index++)
            master_palette[master_palette_count++] = required_colors[required_index];

        // count the number of required models, instances in the master scene
        uint32_t max_layers = 1;  // we don't actually merge layers. Every instance will be in layer 0.
        uint32_t max_models = 0;
        uint32_t max_instances = 0;
        uint32_t max_groups = 1;  // we add 1 root global group that everything will ultimately be parented to.
        for (uint32_t scene_index = 0; scene_index < scene_count; scene_index++) {
            if (!scenes[scene_index])
                continue;
            max_instances += scenes[scene_index]->num_instances;
            max_models += scenes[scene_index]->num_models;
            max_groups += scenes[scene_index]->num_groups;
        }

        // allocate the master instances array
        ogt_vox_instance* instances     = (ogt_vox_instance*)_vox_malloc(sizeof(ogt_vox_instance) * max_instances);
        ogt_vox_model**   models        = (ogt_vox_model**)_vox_malloc(sizeof(ogt_vox_model*) * max_models);
        ogt_vox_layer*    layers        = (ogt_vox_layer*)_vox_malloc(sizeof(ogt_vox_layer) * max_layers);
        ogt_vox_group*    groups        = (ogt_vox_group*)_vox_malloc(sizeof(ogt_vox_group) * max_groups);
        uint32_t          num_instances = 0;
        uint32_t          num_models    = 0;
        uint32_t          num_layers    = 0;

        // add a single layer.
        layers[num_layers].hidden = false;
        layers[num_layers].color  = {255, 255, 255, 255};
        layers[num_layers].name = "merged";
        num_layers++;

        // magicavoxel expects exactly 1 root group, so if we have multiple scenes with multiple roots,
        // we must ensure all merged scenes are parented to the same root group. Allocate it now for the
        // merged scene.
        uint32_t global_root_group_index = 0;
        {
            ogt_vox_group root_group;
            root_group.name                    = NULL;
            root_group.hidden                  = false;
            root_group.layer_index             = 0;
            root_group.parent_group_index      = k_invalid_group_index;
            root_group.transform               = ogt_vox_transform_get_identity();
            clear_anim_transform(&root_group.transform_anim);
            groups[0] = root_group;
        }
        uint32_t num_groups = 1; // we just wrote the global root group index, so all per-scene groups are allocated after.

        // go ahead and do the merge now!
        _vox_array<uint32_t> per_scene_base_model_index;
        _vox_array<uint32_t> per_scene_base_instance_index;
        size_t misc_data_size = 0;
        int32_t offset_x = 0;
        for (uint32_t scene_index = 0; scene_index < scene_count; scene_index++) {
            const ogt_vox_scene* scene = scenes[scene_index];
            if (!scene)
                continue;

            // update the master palette, and get the map of this scene's color indices into the master palette.
            uint32_t scene_color_index_to_master_map[256];
            update_master_palette_and_materials_from_scene(master_palette, master_palette_count, scene, scene_color_index_to_master_map, materials);

            // cache away the base model index for this scene.
            uint32_t base_model_index = num_models;
            uint32_t base_group_index = num_groups;

            per_scene_base_model_index.push_back(base_model_index);
            per_scene_base_instance_index.push_back(num_instances);

            // create copies of all models that have color indices remapped.
            for (uint32_t model_index = 0; model_index < scene->num_models; model_index++) {
                const ogt_vox_model* model = scene->models[model_index];
                uint32_t voxel_count = model->size_x * model->size_y * model->size_z;
                // clone the model
                ogt_vox_model* override_model = (ogt_vox_model*)_vox_malloc(sizeof(ogt_vox_model) + voxel_count);
                uint8_t * override_voxel_data = (uint8_t*)& override_model[1];

                // remap all color indices in the cloned model so they reference the master palette now!
                for (uint32_t voxel_index = 0; voxel_index < voxel_count; voxel_index++) {
                    uint8_t  old_color_index = model->voxel_data[voxel_index];
                    uint32_t new_color_index = scene_color_index_to_master_map[old_color_index];
                    ogt_assert(new_color_index < 256, "color index out of bounds");
                    override_voxel_data[voxel_index] = (uint8_t)new_color_index;
                }
                // assign the new model.
                *override_model = *model;
                override_model->voxel_data = override_voxel_data;
                override_model->voxel_hash = _vox_hash(override_voxel_data, voxel_count);

                models[num_models++] = override_model;
            }

            // compute the scene bounding box on x dimension. this is used to offset instances
            // and groups in the merged model along X dimension such that they do not overlap
            // with instances from another scene in the merged model.
            int32_t scene_min_x, scene_max_x;
            compute_scene_bounding_box_x(scene, scene_min_x, scene_max_x);
            float scene_offset_x = (float)(offset_x - scene_min_x);

            // each scene has a root group, and it must the 0th group in its local groups[] array,
            ogt_assert(scene->groups[0].parent_group_index == k_invalid_group_index, "first group of scene must not be parented to any other group");
            // create copies of all groups into the merged scene (except the root group from each scene -- which is why we start group_index at 1 here)
            for (uint32_t group_index = 1; group_index < scene->num_groups; group_index++) {
                const ogt_vox_group* src_group = &scene->groups[group_index];
                ogt_assert(src_group->parent_group_index != k_invalid_group_index, "all groups after the first in the scene must be parented to a valid group"); // there can be only 1 root group per scene and it must be the 0th group.
                ogt_vox_group dst_group = *src_group;
                ogt_assert(dst_group.parent_group_index < scene->num_groups, "group index is out of bounds");
                dst_group.layer_index        = 0;
                dst_group.parent_group_index = (dst_group.parent_group_index == 0) ? global_root_group_index : base_group_index + (dst_group.parent_group_index - 1);
                if (dst_group.name)
                    misc_data_size += _vox_strlen(dst_group.name) + 1; // + 1 for zero terminator
                if (dst_group.transform_anim.num_keyframes)
                    misc_data_size += (sizeof(ogt_vox_keyframe_transform) * dst_group.transform_anim.num_keyframes);
                // if this group belongs to the global root group, it must be translated so it doesn't overlap with other scenes.
                if (dst_group.parent_group_index == global_root_group_index)
                    dst_group.transform.m30 += scene_offset_x;
                groups[num_groups++] = dst_group;
            }

            // create copies of all instances (and bias them such that minimum on x starts at zero)
            for (uint32_t instance_index = 0; instance_index < scene->num_instances; instance_index++) {
                const ogt_vox_instance* src_instance = &scene->instances[instance_index];
                ogt_assert(src_instance->group_index < scene->num_groups, "group index is out of bounds");  // every instance must be mapped to a group.
                ogt_vox_instance* dst_instance = &instances[num_instances++];
                *dst_instance = *src_instance;
                dst_instance->layer_index = 0;
                dst_instance->group_index = (dst_instance->group_index == 0) ? global_root_group_index : base_group_index + (dst_instance->group_index - 1);
                dst_instance->model_index += base_model_index;
                if (dst_instance->name)
                    misc_data_size += _vox_strlen(dst_instance->name) + 1; // + 1 for zero terminator
                if (dst_instance->transform_anim.num_keyframes)
                    misc_data_size += (sizeof(ogt_vox_keyframe_transform) * dst_instance->transform_anim.num_keyframes);
                if (dst_instance->model_anim.num_keyframes)
                    misc_data_size += (sizeof(ogt_vox_keyframe_model) * dst_instance->model_anim.num_keyframes);

                // if this instance belongs to the global root group, it must be translated so it doesn't overlap with other scenes.
                if (dst_instance->group_index == global_root_group_index)
                    dst_instance->transform.m30 += scene_offset_x;
            }

            offset_x += (scene_max_x - scene_min_x); // step the width of the scene in x dimension
            offset_x += 4;                           // a margin of this many voxels between scenes
        }

        // fill any unused master palette entries with purple/invalid color.
        const ogt_vox_rgba k_invalid_color = { 255, 0, 255, 255 };  // purple = invalid
        for (uint32_t color_index = master_palette_count; color_index < 256; color_index++)
            master_palette[color_index] = k_invalid_color;

        // assign the master scene on output. misc_data is part of the scene allocation.
        size_t scene_size = sizeof(ogt_vox_scene) + misc_data_size;
        ogt_vox_scene * merged_scene = (ogt_vox_scene*)_vox_calloc(scene_size);

        // copy name and keyframe data into the misc_data section and make instances/groups point to it.
        // This makes the merged model self-contained.
        {
            char* scene_misc_data = (char*)&merged_scene[1];
            for (uint32_t instance_index = 0; instance_index < num_instances; instance_index++) {
                if (instances[instance_index].name) {
                    size_t string_len = _vox_strlen(instances[instance_index].name) + 1; // +1 for zero terminator
                    memcpy(scene_misc_data, instances[instance_index].name, string_len);
                    instances[instance_index].name = scene_misc_data;
                    scene_misc_data += string_len;
                }
                if (instances[instance_index].model_anim.num_keyframes) {
                    ogt_vox_keyframe_model* model_keyframes = (ogt_vox_keyframe_model*)scene_misc_data;
                    uint32_t keyframe_size = sizeof(ogt_vox_keyframe_model) * instances[instance_index].model_anim.num_keyframes;
                    memcpy(scene_misc_data, instances[instance_index].model_anim.keyframes, keyframe_size);
                    instances[instance_index].model_anim.keyframes = model_keyframes;
                    scene_misc_data += keyframe_size;
                    // bias the model_index in model_keyframes back into the range for the scene that this instance came from.
                    for (int32_t scene_index = (int32_t)(per_scene_base_instance_index.size() - 1); scene_index >= 0; scene_index--) {
                        if (instance_index >= per_scene_base_instance_index[scene_index]) {
                            for (uint32_t j = 0; j < instances[instance_index].model_anim.num_keyframes; j++)
                                model_keyframes[j].model_index += per_scene_base_model_index[scene_index];
                            break;
                        }
                    }
                }
                if (instances[instance_index].transform_anim.num_keyframes) {
                    uint32_t keyframe_size = sizeof(ogt_vox_keyframe_transform) * instances[instance_index].transform_anim.num_keyframes;
                    memcpy(scene_misc_data, instances[instance_index].transform_anim.keyframes, keyframe_size);
                    instances[instance_index].transform_anim.keyframes = (ogt_vox_keyframe_transform*)scene_misc_data;
                    scene_misc_data += keyframe_size;
                }
            }
            for (uint32_t group_index = 0; group_index < num_groups; group_index++) {
                if (groups[group_index].name) {
                    size_t string_len = _vox_strlen(groups[group_index].name) + 1; // +1 for zero terminator
                    memcpy(scene_misc_data, groups[group_index].name, string_len);
                    groups[group_index].name = scene_misc_data;
                    scene_misc_data += string_len;
                }
                if (groups[group_index].transform_anim.num_keyframes) {
                    uint32_t keyframe_size = sizeof(ogt_vox_keyframe_transform) * groups[group_index].transform_anim.num_keyframes;
                    memcpy(scene_misc_data, groups[group_index].transform_anim.keyframes, keyframe_size);
                    groups[group_index].transform_anim.keyframes = (ogt_vox_keyframe_transform*)scene_misc_data;
                    scene_misc_data += keyframe_size;
                }
            }

            ogt_assert(scene_misc_data <= ((char*)&merged_scene[1] + misc_data_size), "misc_data allocation was overrun");
        }

        ogt_assert(num_groups <= max_groups, "sanity check failed. we wrote more groups than we allocated");

        memset(merged_scene, 0, sizeof(ogt_vox_scene));
        merged_scene->instances     = instances;
        merged_scene->num_instances = max_instances;
        merged_scene->models        = (const ogt_vox_model * *)models;
        merged_scene->num_models    = max_models;
        merged_scene->layers        = layers;
        merged_scene->num_layers    = max_layers;
        merged_scene->groups        = groups;
        merged_scene->num_groups    = num_groups;
        // copy color palette into the merged scene
        for (uint32_t color_index = 0; color_index < 256; color_index++)
            merged_scene->palette.color[color_index] = master_palette[color_index];
        // copy materials into the merged scene
        for (uint32_t color_index = 0; color_index < 256; color_index++)
            merged_scene-> materials.matl[color_index] = materials[color_index];

        return merged_scene;
    }